

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
FreeHeapBlock(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
              *this,SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *heapBlock_local;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *this_local
  ;
  
  SmallHeapBlockT<SmallAllocationBlockAttributes>::Reset
            ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock);
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::SetNextBlock
            (&heapBlock->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,
             &this->emptyBlockList->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>);
  this->emptyBlockList = heapBlock;
  (this->super_HeapBucket).emptyHeapBlockCount = (this->super_HeapBucket).emptyHeapBlockCount + 1;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::FreeHeapBlock(TBlockType * heapBlock)
{
    heapBlock->Reset();
    heapBlock->SetNextBlock(emptyBlockList);
    emptyBlockList = heapBlock;
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    this->emptyHeapBlockCount++;
#endif
}